

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_ec.cc
# Opt level: O1

int pkey_ec_copy(EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  
  puVar2 = (undefined8 *)OPENSSL_zalloc(0x10);
  if (puVar2 != (undefined8 *)0x0) {
    dst->data = puVar2;
    puVar1 = (undefined8 *)src->data;
    *puVar2 = *puVar1;
    puVar2[1] = puVar1[1];
  }
  return (uint)(puVar2 != (undefined8 *)0x0);
}

Assistant:

static int pkey_ec_copy(EVP_PKEY_CTX *dst, EVP_PKEY_CTX *src) {
  if (!pkey_ec_init(dst)) {
    return 0;
  }

  const EC_PKEY_CTX *sctx = reinterpret_cast<EC_PKEY_CTX *>(src->data);
  EC_PKEY_CTX *dctx = reinterpret_cast<EC_PKEY_CTX *>(dst->data);
  dctx->md = sctx->md;
  dctx->gen_group = sctx->gen_group;
  return 1;
}